

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O2

VP8Decoder * VP8New(void)

{
  int iVar1;
  VP8Decoder *pVVar2;
  WebPWorkerInterface *pWVar3;
  
  pVVar2 = (VP8Decoder *)WebPSafeCalloc(1,0xbd0);
  if (pVVar2 != (VP8Decoder *)0x0) {
    pVVar2->status = VP8_STATUS_OK;
    pVVar2->error_msg = "OK";
    pWVar3 = WebPGetWorkerInterface();
    (*pWVar3->Init)(&pVVar2->worker);
    pVVar2->ready = 0;
    pVVar2->num_parts_minus_one = 0;
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)InitGetCoeffs_InitGetCoeffs_body_lock);
    if (iVar1 == 0) {
      if ((VP8CPUInfo)InitGetCoeffs_InitGetCoeffs_body_last_cpuinfo_used != VP8GetCPUInfo) {
        if ((VP8GetCPUInfo == (VP8CPUInfo)0x0) || (iVar1 = (*VP8GetCPUInfo)(kSlowSSSE3), iVar1 == 0)
           ) {
          GetCoeffs = GetCoeffsFast;
        }
        else {
          GetCoeffs = GetCoeffsAlt;
        }
      }
      InitGetCoeffs_InitGetCoeffs_body_last_cpuinfo_used = VP8GetCPUInfo;
      pthread_mutex_unlock((pthread_mutex_t *)InitGetCoeffs_InitGetCoeffs_body_lock);
    }
  }
  return pVVar2;
}

Assistant:

VP8Decoder* VP8New(void) {
  VP8Decoder* const dec = (VP8Decoder*)WebPSafeCalloc(1ULL, sizeof(*dec));
  if (dec != NULL) {
    SetOk(dec);
    WebPGetWorkerInterface()->Init(&dec->worker);
    dec->ready = 0;
    dec->num_parts_minus_one = 0;
    InitGetCoeffs();
  }
  return dec;
}